

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

Node * __thiscall ExprEval::Tokenizer::get(Node *__return_storage_ptr__,Tokenizer *this)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *this_00;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this_01;
  ulong uVar5;
  char *pcVar6;
  reference pvVar7;
  size_type sVar8;
  ulong uVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  long lVar12;
  Exception *this_02;
  double num;
  byte local_269;
  string local_240 [39];
  undefined1 local_219;
  __cxx11 local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  size_t local_1b8;
  size_t new_index;
  value_type custom_operator;
  size_t length_1;
  size_t i_1;
  size_t custom_opr_length;
  size_t custom_opr_index;
  ulong local_b8;
  size_t length;
  size_t i;
  size_t opr_length;
  size_t opr_index;
  size_t local_78;
  size_t beg;
  string number;
  Exception *e;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *custom_table;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *m_table;
  Tokenizer *this_local;
  Node *node;
  
  Engine::Node::Node(__return_storage_ptr__);
  this_00 = Operator::get_spec_table();
  this_01 = Operator::get_custom_table();
  while( true ) {
    uVar9 = this->m_index;
    uVar5 = std::__cxx11::string::size();
    local_269 = 1;
    if (uVar5 <= uVar9) {
      bVar2 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::empty
                        (&this->m_cache);
      local_269 = bVar2 ^ 0xff;
    }
    if ((local_269 & 1) == 0) {
      __return_storage_ptr__->type = Empty;
      return __return_storage_ptr__;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar6 != ' ') break;
    this->m_index = this->m_index + 1;
  }
  bVar2 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::empty
                    (&this->m_cache);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar6 == '(') {
      tokenize(this);
      pvVar7 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::back
                         (&this->m_cache);
      Engine::Node::operator=(__return_storage_ptr__,pvVar7);
      std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::pop_back
                (&this->m_cache);
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar2 = is_digit(this,*pcVar6);
      if (bVar2) {
        std::__cxx11::string::string((string *)&beg);
        local_78 = this->m_index;
        while( true ) {
          uVar9 = this->m_index;
          uVar5 = std::__cxx11::string::size();
          bVar2 = false;
          if (uVar9 < uVar5) {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this);
            bVar3 = is_digit(this,*pcVar6);
            bVar2 = true;
            if (!bVar3) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this);
              bVar2 = *pcVar6 == '.';
            }
          }
          if (!bVar2) break;
          std::__cxx11::string::operator[]((ulong)this);
          std::__cxx11::string::push_back((char)&beg);
          this->m_index = this->m_index + 1;
        }
        std::__cxx11::string::substr((ulong)&opr_index,(ulong)this);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        num = strtod(pcVar6,(char **)0x0);
        Engine::Node::set(__return_storage_ptr__,num);
        std::__cxx11::string::~string((string *)&opr_index);
        std::__cxx11::string::~string((string *)&beg);
      }
      else {
        i = 0;
        for (length = 0; sVar1 = length,
            sVar8 = std::
                    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                    ::size(this_00), sVar1 < sVar8; length = length + 1) {
          std::
          vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
          ::at(this_00,length);
          local_b8 = std::__cxx11::string::size();
          uVar9 = this->m_index + local_b8;
          uVar5 = std::__cxx11::string::size();
          if (uVar9 <= uVar5) {
            pvVar10 = std::
                      vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                      ::at(this_00,length);
            std::__cxx11::string::substr((ulong)&custom_opr_index,(ulong)this);
            iVar4 = std::__cxx11::string::compare((string *)&pvVar10->symbol);
            std::__cxx11::string::~string((string *)&custom_opr_index);
            if ((iVar4 == 0) && (i < local_b8)) {
              i = local_b8;
              opr_length = length;
            }
          }
        }
        if (i == 0) {
          i_1 = 0;
          for (length_1 = 0;
              sVar8 = std::
                      vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                      ::size(this_01), length_1 < sVar8; length_1 = length_1 + 1) {
            std::
            vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
            ::at(this_01,length_1);
            uVar9 = std::__cxx11::string::size();
            sVar1 = this->m_index;
            uVar5 = std::__cxx11::string::size();
            if (sVar1 + uVar9 <= uVar5) {
              pvVar11 = std::
                        vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                        ::at(this_01,length_1);
              std::__cxx11::string::substr((ulong)&custom_operator.field_0x90,(ulong)this);
              iVar4 = std::__cxx11::string::compare((string *)&pvVar11->symbol);
              std::__cxx11::string::~string((string *)&custom_operator.field_0x90);
              if ((iVar4 == 0) && (i_1 < uVar9)) {
                custom_opr_length = length_1;
                i_1 = uVar9;
              }
            }
          }
          if (i_1 == 0) {
            local_219 = 1;
            this_02 = (Exception *)__cxa_allocate_exception(0x30);
            std::__cxx11::to_string(local_218,this->m_index);
            std::operator+((char *)local_1f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "node @ ");
            Engine::Exception::Exception(this_02,Symbol_Not_Found,local_1f8);
            local_219 = 0;
            __cxa_throw(this_02,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
          }
          pvVar11 = std::
                    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                    ::at(this_01,custom_opr_length);
          Operator::CustomOperator::CustomOperator((CustomOperator *)&new_index,pvVar11);
          sVar1 = this->m_index;
          lVar12 = std::__cxx11::string::size();
          local_1b8 = sVar1 + lVar12;
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)this);
          Engine::Node::set(__return_storage_ptr__,local_1d8,false);
          std::__cxx11::string::~string((string *)local_1d8);
          this->m_index = local_1b8;
          Operator::CustomOperator::~CustomOperator((CustomOperator *)&new_index);
        }
        else {
          this->m_index = (i - 1) + this->m_index;
          pvVar10 = std::
                    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
                    ::at(this_00,opr_length);
          std::__cxx11::string::string(local_240,(string *)&pvVar10->symbol);
          Engine::Node::set(__return_storage_ptr__,(string *)local_240,false);
          std::__cxx11::string::~string(local_240);
          this->m_index = this->m_index + 1;
        }
      }
    }
  }
  else {
    pvVar7 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::back
                       (&this->m_cache);
    Engine::Node::operator=(__return_storage_ptr__,pvVar7);
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::pop_back
              (&this->m_cache);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Tokenizer::get(){
        Node node;
        auto m_table = Operator::get_spec_table();
        auto custom_table = Operator::get_custom_table();
        // std::cout<<" >> current index: "<<m_index<<'\n';
        while(m_index < m_expression.size() || !m_cache.empty()){
            if(m_expression[m_index] == ' '){
                ++m_index;
                continue;
            }
            while(!m_cache.empty()){
                node = m_cache.back();
                m_cache.pop_back();
                return node;
            }

            if(m_expression[m_index] == '('){
                try
                {
                    tokenize();
                    node = m_cache.back();
                    m_cache.pop_back();
                }
                catch(const Engine::Exception& e)
                {
                    throw e;
                }
                return node;
            }
            else if(is_digit(m_expression[m_index])){
                std::string number;
                size_t beg = m_index;
                while(m_index < m_expression.size() && (is_digit(m_expression[m_index]) || m_expression[m_index] == '.')){
                    number.push_back(m_expression[m_index]);
                    ++m_index;
                }
                node.set(strtod(m_expression.substr(beg, m_index-beg).c_str(), nullptr));
                return node;
            }
            
            size_t opr_index, opr_length = 0;
            for (size_t i=0; i<m_table->size(); ++i){
                size_t length = m_table->at(i).symbol.size();
                if(m_index + length > m_expression.size()) continue;
                if(m_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                    if(opr_length < length){
                        opr_length = length;
                        opr_index = i;
                    }
                }
            }

            if(!opr_length){
                // std::cout<<"searching for user-defined symbols...\n";
                size_t custom_opr_index, custom_opr_length = 0;
                for(size_t i=0; i<custom_table->size(); ++i){
                    size_t length = custom_table->at(i).symbol.size();
                    if(m_index + length > m_expression.size()) continue;
                    if(custom_table->at(i).symbol.compare(m_expression.substr(m_index, length)) == 0){
                        if(custom_opr_length < length){
                            custom_opr_length = length;
                            custom_opr_index = i;
                        }
                    }
                }
                if(custom_opr_length){
                    // std::cout<<"custom operator index: "<<custom_opr_index<<'\n';
                    auto custom_operator = custom_table->at(custom_opr_index);
                    // std::cout<<"custom operator: "<<custom_operator.symbol<<'\n';
                    size_t new_index = m_index+custom_operator.symbol.size();
                    // std::cout<<"parsed symbol: "<<m_expression.substr(m_index, new_index-m_index)<<'\n';
                    node.set(m_expression.substr(m_index, new_index-m_index), false);
                    m_index = new_index;

                    return node;
                }
                else{
                    throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(m_index));
                }
            }
            else{
                m_index += opr_length - 1;

                node.set(m_table->at(opr_index).symbol, false);
                ++m_index;
                return node;
            }
        }

        node.type = NodeType::Empty;
        return node;
    }